

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibCore.cpp
# Opt level: O2

Variant * Jinx::Impl::IsFinished
                    (Variant *__return_storage_ptr__,ScriptPtr *script,Parameters *params)

{
  pointer pVVar1;
  bool value;
  char *message;
  ScriptIPtr s;
  undefined8 *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  shared_ptr<Jinx::IScript> local_20;
  
  std::static_pointer_cast<Jinx::Impl::Script,Jinx::IScript>(&local_20);
  pVVar1 = (params->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pVVar1 == (params->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>)._M_impl
                .super__Vector_impl_data._M_finish) {
    message = "\'is finished\' function invoked with no parameters";
  }
  else {
    if (pVVar1->m_type == Coroutine) {
      Variant::GetCoroutine((Variant *)&local_30);
      value = (bool)(**(code **)*local_30)();
      Variant::Variant(__return_storage_ptr__,value);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
      goto LAB_00118f99;
    }
    message = "Invalid parameters to \'is finished\' function";
  }
  Script::Error((Script *)
                local_20.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                message);
  __return_storage_ptr__->m_type = Null;
  Variant::SetNull(__return_storage_ptr__);
LAB_00118f99:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant IsFinished(ScriptPtr script, const Parameters & params)
	{
		ScriptIPtr s = std::static_pointer_cast<Script>(script);
		if (params.empty())
		{
			s->Error("'is finished' function invoked with no parameters");
			return nullptr;
		}
		if (!params[0].IsCoroutine())
		{
			s->Error("Invalid parameters to 'is finished' function");
			return nullptr;
		}
		return params[0].GetCoroutine()->IsFinished();
	}